

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

int imagetopnm(opj_image_t *image,char *outfile,int force_split)

{
  OPJ_UINT32 OVar1;
  OPJ_INT32 *pOVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  FILE *pFVar6;
  undefined8 uVar7;
  opj_image_comp_t *poVar8;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  char *tt;
  int iVar17;
  uint *local_78;
  uint *local_70;
  uint *local_68;
  int local_58;
  int local_54;
  
  poVar8 = image->comps;
  OVar1 = poVar8->prec;
  pcVar5 = outfile;
  if (0x10 < (int)OVar1) {
    fprintf(_stderr,"%s:%d:imagetopnm\n\tprecision %d is larger than 16\n\t: refused.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/bin/jp2/convert.c"
            ,0x6ea,OVar1);
    return 1;
  }
  do {
    pcVar9 = pcVar5;
    pcVar5 = pcVar9 + 1;
  } while (*pcVar9 != '\0');
  uVar14 = 1;
  if ((pcVar9[-2] & 0xdfU) != 0x47) {
    uVar14 = image->numcomps;
  }
  if ((force_split != 0) ||
     ((uVar14 != 2 &&
      (((((uVar14 < 3 || (poVar8->dx != poVar8[1].dx)) || (poVar8->dx != poVar8[2].dx)) ||
        ((poVar8->dy != poVar8[1].dy || (poVar8->dy != poVar8[2].dy)))) ||
       ((OVar1 != poVar8[1].prec || (OVar1 != poVar8[2].prec)))))))) {
    if (uVar14 < image->numcomps) {
      imagetopnm_cold_1();
    }
    sVar4 = strlen(outfile);
    pcVar5 = (char *)malloc(sVar4 + 8);
    if (pcVar5 == (char *)0x0) {
      imagetopnm_cold_3();
      return 1;
    }
    if (uVar14 != 0) {
      uVar13 = 0;
      do {
        if (uVar14 == 1) {
          strcpy(pcVar5,outfile);
        }
        else {
          sVar4 = strlen(outfile);
          strncpy(pcVar5,outfile,sVar4 - 4);
          sprintf(pcVar5 + (sVar4 - 4),"_%u.pgm",uVar13 & 0xffffffff);
        }
        pFVar6 = fopen(pcVar5,"wb");
        if (pFVar6 == (FILE *)0x0) {
          imagetopnm_cold_2();
          return 1;
        }
        poVar8 = image->comps;
        uVar10 = poVar8[uVar13].w;
        uVar3 = poVar8[uVar13].h;
        OVar1 = poVar8[uVar13].prec;
        uVar7 = opj_version();
        iVar17 = 0;
        fprintf(pFVar6,"P5\n#OpenJPEG-%s\n%d %d\n%d\n",uVar7,(ulong)uVar10,(ulong)uVar3,
                (ulong)(uint)~(-1 << ((byte)OVar1 & 0x1f)));
        poVar8 = image->comps;
        if (poVar8[uVar13].sgnd != 0) {
          iVar17 = 1 << ((char)poVar8[uVar13].prec - 1U & 0x1f);
        }
        pOVar2 = poVar8[uVar13].data;
        iVar16 = uVar3 * uVar10;
        if ((int)OVar1 < 9) {
          if (0 < iVar16) {
            lVar12 = 0;
            do {
              uVar3 = pOVar2[lVar12] + iVar17;
              uVar10 = 0;
              if (0 < (int)uVar3) {
                uVar10 = uVar3;
              }
              uVar10 = uVar10 & 0xff;
              if (0xff < (int)uVar3) {
                uVar10 = 0xff;
              }
              fputc(uVar10,pFVar6);
              lVar12 = lVar12 + 1;
            } while (iVar16 != (int)lVar12);
          }
        }
        else if (0 < iVar16) {
          lVar12 = 0;
          do {
            uVar10 = pOVar2[lVar12] + iVar17;
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            if (0xfffe < (int)uVar10) {
              uVar10 = 0xffff;
            }
            fprintf(pFVar6,"%c%c",(ulong)(uVar10 >> 8),(ulong)uVar10 & 0xff);
            lVar12 = lVar12 + 1;
          } while (iVar16 != (int)lVar12);
        }
        fclose(pFVar6);
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar14);
    }
    free(pcVar5);
    return 0;
  }
  pFVar6 = fopen(outfile,"wb");
  if (pFVar6 == (FILE *)0x0) {
    fprintf(_stderr,"ERROR -> failed to open %s for writing\n",outfile);
    return 1;
  }
  iVar17 = 0;
  poVar8 = image->comps;
  uVar10 = poVar8->w;
  uVar3 = poVar8->h;
  uVar11 = ~(-1 << ((byte)OVar1 & 0x1f));
  pOVar2 = poVar8->data;
  if (uVar14 < 3) {
    pcVar5 = "GRAYSCALE_ALPHA";
    local_68 = (uint *)0x0;
    local_70 = (uint *)0x0;
  }
  else {
    local_68 = (uint *)poVar8[1].data;
    local_70 = (uint *)poVar8[2].data;
    if (uVar14 != 4) {
      uVar7 = opj_version();
      iVar17 = 0;
      fprintf(pFVar6,"P6\n# OpenJPEG-%s\n%d %d\n%d\n",uVar7,(ulong)uVar10,(ulong)uVar3,(ulong)uVar11
             );
      poVar8 = image->comps;
      local_78 = (uint *)0x0;
      goto LAB_0010a041;
    }
    pcVar5 = "RGB_ALPHA";
  }
  uVar7 = opj_version();
  fprintf(pFVar6,
          "P7\n# OpenJPEG-%s\nWIDTH %d\nHEIGHT %d\nDEPTH %u\nMAXVAL %d\nTUPLTYPE %s\nENDHDR\n",uVar7
          ,(ulong)uVar10,(ulong)uVar3,(ulong)uVar14,(ulong)uVar11,pcVar5);
  poVar8 = image->comps;
  local_78 = (uint *)poVar8[(ulong)uVar14 - 1].data;
  if (poVar8[(ulong)uVar14 - 1].sgnd != 0) {
    iVar17 = 1 << ((char)poVar8[(ulong)uVar14 - 1].prec - 1U & 0x1f);
  }
LAB_0010a041:
  local_54 = 0;
  iVar16 = 0;
  if (poVar8->sgnd != 0) {
    iVar16 = 1 << ((char)poVar8->prec - 1U & 0x1f);
  }
  local_58 = 0;
  if (2 < uVar14) {
    local_58 = 0;
    local_54 = 0;
    if (poVar8[1].sgnd != 0) {
      local_54 = 1 << ((char)poVar8[1].prec - 1U & 0x1f);
    }
    if (poVar8[2].sgnd != 0) {
      local_58 = 1 << ((char)poVar8[2].prec - 1U & 0x1f);
    }
  }
  if (0 < (int)(uVar3 * uVar10)) {
    lVar12 = 0;
    do {
      uVar11 = pOVar2[lVar12];
      if ((int)OVar1 < 9) {
        uVar15 = 0;
        if (0 < (int)uVar11) {
          uVar15 = uVar11;
        }
        uVar15 = uVar15 & 0xff;
        if (0xff < (int)uVar11) {
          uVar15 = 0xff;
        }
        fputc(uVar15,pFVar6);
        if (2 < uVar14) {
          uVar11 = *local_68;
          local_68 = local_68 + 1;
          uVar15 = 0;
          if (0 < (int)uVar11) {
            uVar15 = uVar11;
          }
          uVar15 = uVar15 & 0xff;
          if (0xff < (int)uVar11) {
            uVar15 = 0xff;
          }
          fputc(uVar15,pFVar6);
          uVar11 = *local_70;
          local_70 = local_70 + 1;
          uVar15 = 0;
          if (0 < (int)uVar11) {
            uVar15 = uVar11;
          }
          uVar15 = uVar15 & 0xff;
          if (0xff < (int)uVar11) {
            uVar15 = 0xff;
          }
          fputc(uVar15,pFVar6);
        }
        if ((uVar14 == 4) || (uVar14 == 2)) {
          uVar11 = *local_78;
          local_78 = local_78 + 1;
          uVar15 = 0;
          if (0 < (int)uVar11) {
            uVar15 = uVar11;
          }
          uVar15 = uVar15 & 0xff;
          if (0xff < (int)uVar11) {
            uVar15 = 0xff;
          }
          fputc(uVar15,pFVar6);
        }
      }
      else {
        uVar11 = uVar11 + iVar16;
        if ((int)uVar11 < 1) {
          uVar11 = 0;
        }
        if (0xfffe < (int)uVar11) {
          uVar11 = 0xffff;
        }
        fprintf(pFVar6,"%c%c",(ulong)(uVar11 >> 8));
        if (2 < uVar14) {
          uVar11 = *local_68 + local_54;
          local_68 = local_68 + 1;
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if (0xfffe < (int)uVar11) {
            uVar11 = 0xffff;
          }
          fprintf(pFVar6,"%c%c",(ulong)(uVar11 >> 8),(ulong)(uVar11 & 0xff));
          uVar11 = *local_70 + local_58;
          local_70 = local_70 + 1;
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if (0xfffe < (int)uVar11) {
            uVar11 = 0xffff;
          }
          fprintf(pFVar6,"%c%c",(ulong)(uVar11 >> 8));
        }
        if ((uVar14 == 4) || (uVar14 == 2)) {
          uVar11 = *local_78 + iVar17;
          local_78 = local_78 + 1;
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          uVar13 = (ulong)uVar11;
          if (0xfffe < (int)uVar11) {
            uVar13 = 0xffff;
          }
          fprintf(pFVar6,"%c%c",uVar13 >> 8);
        }
      }
      lVar12 = lVar12 + 1;
    } while (uVar3 * uVar10 != (int)lVar12);
  }
  fclose(pFVar6);
  return 0;
}

Assistant:

int imagetopnm(opj_image_t * image, const char *outfile, int force_split)
{
    int *red, *green, *blue, *alpha;
    int wr, hr, max;
    int i;
    unsigned int compno, ncomp;
    int adjustR, adjustG, adjustB, adjustA;
    int fails, two, want_gray, has_alpha, triple;
    int prec, v;
    FILE *fdest = NULL;
    const char *tmp = outfile;
    char *destname;

    alpha = NULL;

    if((prec = (int)image->comps[0].prec) > 16)
    {
        fprintf(stderr,"%s:%d:imagetopnm\n\tprecision %d is larger than 16"
                "\n\t: refused.\n",__FILE__,__LINE__,prec);
        return 1;
    }
    two = has_alpha = 0; fails = 1;
    ncomp = image->numcomps;

    while (*tmp) ++tmp; tmp -= 2;
    want_gray = (*tmp == 'g' || *tmp == 'G');
    ncomp = image->numcomps;

    if(want_gray) ncomp = 1;

    if ((force_split == 0) &&
				(ncomp == 2 /* GRAYA */
            || (ncomp > 2 /* RGB, RGBA */
                && image->comps[0].dx == image->comps[1].dx
                && image->comps[1].dx == image->comps[2].dx
                && image->comps[0].dy == image->comps[1].dy
                && image->comps[1].dy == image->comps[2].dy
                && image->comps[0].prec == image->comps[1].prec
                && image->comps[1].prec == image->comps[2].prec
                )))
		{
        fdest = fopen(outfile, "wb");

        if (!fdest)
        {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", outfile);
            return fails;
        }
        two = (prec > 8);
        triple = (ncomp > 2);
        wr = (int)image->comps[0].w; hr = (int)image->comps[0].h;
        max = (1<<prec) - 1; has_alpha = (ncomp == 4 || ncomp == 2);

        red = image->comps[0].data;

        if(triple)
        {
            green = image->comps[1].data;
            blue = image->comps[2].data;
        }
        else green = blue = NULL;

        if(has_alpha)
        {
            const char *tt = (triple?"RGB_ALPHA":"GRAYSCALE_ALPHA");

            fprintf(fdest, "P7\n# OpenJPEG-%s\nWIDTH %d\nHEIGHT %d\nDEPTH %u\n"
                    "MAXVAL %d\nTUPLTYPE %s\nENDHDR\n", opj_version(),
                    wr, hr, ncomp, max, tt);
            alpha = image->comps[ncomp - 1].data;
            adjustA = (image->comps[ncomp - 1].sgnd ?
                        1 << (image->comps[ncomp - 1].prec - 1) : 0);
        }
        else
        {
            fprintf(fdest, "P6\n# OpenJPEG-%s\n%d %d\n%d\n",
                    opj_version(), wr, hr, max);
            adjustA = 0;
        }
        adjustR = (image->comps[0].sgnd ? 1 << (image->comps[0].prec - 1) : 0);

        if(triple)
        {
            adjustG = (image->comps[1].sgnd ? 1 << (image->comps[1].prec - 1) : 0);
            adjustB = (image->comps[2].sgnd ? 1 << (image->comps[2].prec - 1) : 0);
        }
        else adjustG = adjustB = 0;

        for(i = 0; i < wr * hr; ++i)
        {
            if(two)
            {
                v = *red + adjustR; ++red;
                if(v > 65535) v = 65535; else if(v < 0) v = 0;

                /* netpbm: */
                fprintf(fdest, "%c%c",(unsigned char)(v>>8), (unsigned char)v);

                if(triple)
                {
                    v = *green + adjustG; ++green;
                    if(v > 65535) v = 65535; else if(v < 0) v = 0;

                    /* netpbm: */
                    fprintf(fdest, "%c%c",(unsigned char)(v>>8), (unsigned char)v);

                    v =  *blue + adjustB; ++blue;
                    if(v > 65535) v = 65535; else if(v < 0) v = 0;

                    /* netpbm: */
                    fprintf(fdest, "%c%c",(unsigned char)(v>>8), (unsigned char)v);

                }/* if(triple) */

                if(has_alpha)
                {
                    v = *alpha + adjustA; ++alpha;
                    if(v > 65535) v = 65535; else if(v < 0) v = 0;

                    /* netpbm: */
                    fprintf(fdest, "%c%c",(unsigned char)(v>>8), (unsigned char)v);
                }
                continue;

            }	/* if(two) */

            /* prec <= 8: */
            v = *red++;
            if(v > 255) v = 255; else if(v < 0) v = 0;

            fprintf(fdest, "%c", (unsigned char)v);
            if(triple)
            {
                v = *green++;
                if(v > 255) v = 255; else if(v < 0) v = 0;

                fprintf(fdest, "%c", (unsigned char)v);
                v = *blue++;
                if(v > 255) v = 255; else if(v < 0) v = 0;

                fprintf(fdest, "%c", (unsigned char)v);
						}
            if(has_alpha)
            {
                v = *alpha++;
                if(v > 255) v = 255; else if(v < 0) v = 0;

                fprintf(fdest, "%c", (unsigned char)v);
            }
        }	/* for(i */

        fclose(fdest); return 0;
    }

    /* YUV or MONO: */

    if (image->numcomps > ncomp)
    {
        fprintf(stderr,"WARNING -> [PGM file] Only the first component\n");
        fprintf(stderr,"           is written to the file\n");
    }
    destname = (char*)malloc(strlen(outfile) + 8);
    if(destname == NULL){
        fprintf(stderr, "imagetopnm: memory out\n");
        return 1;
    }
    for (compno = 0; compno < ncomp; compno++)
    {
        if (ncomp > 1)
        {
            /*sprintf(destname, "%d.%s", compno, outfile);*/
            const size_t olen = strlen(outfile);
            const size_t dotpos = olen - 4;

            strncpy(destname, outfile, dotpos);
            sprintf(destname+dotpos, "_%u.pgm", compno);
        }
        else
            sprintf(destname, "%s", outfile);

        fdest = fopen(destname, "wb");
        if (!fdest)
        {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", destname);
            free(destname);
            return 1;
        }
        wr = (int)image->comps[compno].w; hr = (int)image->comps[compno].h;
        prec = (int)image->comps[compno].prec;
        max = (1<<prec) - 1;

        fprintf(fdest, "P5\n#OpenJPEG-%s\n%d %d\n%d\n",
                opj_version(), wr, hr, max);

        red = image->comps[compno].data;
        adjustR =
                (image->comps[compno].sgnd ? 1 << (image->comps[compno].prec - 1) : 0);

        if(prec > 8)
        {
            for (i = 0; i < wr * hr; i++)
            {
                v = *red + adjustR; ++red;
                if(v > 65535) v = 65535; else if(v < 0) v = 0;

                /* netpbm: */
                fprintf(fdest, "%c%c",(unsigned char)(v>>8), (unsigned char)v);

                if(has_alpha)
                {
                    v = *alpha++;
                    if(v > 65535) v = 65535; else if(v < 0) v = 0;

                    /* netpbm: */
                    fprintf(fdest, "%c%c",(unsigned char)(v>>8), (unsigned char)v);
                }
            }/* for(i */
        }
        else /* prec <= 8 */
        {
            for(i = 0; i < wr * hr; ++i)
            {
                v = *red + adjustR; ++red;
                if(v > 255) v = 255; else if(v < 0) v = 0;

                fprintf(fdest, "%c", (unsigned char)v);
            }
        }
        fclose(fdest);
    } /* for (compno */
    free(destname);

    return 0;
}